

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall deqp::gles31::Functional::anon_unknown_1::BlitFboCase::deinit(BlitFboCase *this)

{
  BlitFboCase *this_local;
  
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::clear(&this->m_srcFbo);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::clear(&this->m_srcRbo);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::clear(&this->m_dstFbo);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::clear(&this->m_dstRbo);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::clear
            (&this->m_program);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::clear(&this->m_vbo);
  return;
}

Assistant:

void BlitFboCase::deinit (void)
{
	m_srcFbo.clear();
	m_srcRbo.clear();
	m_dstFbo.clear();
	m_dstRbo.clear();
	m_program.clear();
	m_vbo.clear();
}